

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::
     doPrintIVal(FloatFormat *fmt,IVal *ival,ostream *os)

{
  int ndx;
  long lVar1;
  
  std::operator<<(os,"(");
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      if (lVar1 == 4) {
        std::operator<<(os,")");
        return;
      }
      std::operator<<(os,", ");
    }
    Traits<float>::doPrintIVal(fmt,ival->m_data,os);
    lVar1 = lVar1 + 1;
    ival = (IVal *)((long)ival + 0x18);
  } while( true );
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}